

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_lex.c
# Opt level: O3

yajl_tok yajl_lex_lex(yajl_lexer lexer,uchar *jsonText,size_t jsonTextLen,size_t *offset,
                     uchar **outBuf,size_t *outLen)

{
  size_t *psVar1;
  bool bVar2;
  uchar uVar3;
  byte bVar4;
  size_t sVar5;
  uchar *puVar6;
  ulong uVar7;
  size_t sVar8;
  size_t *psVar9;
  int iVar10;
  yajl_lex_error yVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  yajl_tok local_58;
  ulong local_40;
  
  local_40 = *offset;
  *outBuf = (uchar *)0x0;
  *outLen = 0;
  if (*offset < jsonTextLen) {
    psVar1 = &lexer->bufOff;
    do {
      puVar6 = jsonText;
      psVar9 = offset;
      if (((lexer->bufInUse != 0) && (sVar5 = yajl_buf_len(lexer->buf), sVar5 != 0)) &&
         (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), uVar7 < sVar5)) {
        puVar6 = yajl_buf_data(lexer->buf);
        psVar9 = psVar1;
      }
      sVar5 = *psVar9;
      *psVar9 = sVar5 + 1;
      bVar4 = puVar6[sVar5];
      if (0x5a < bVar4) {
        if (bVar4 < 0x6e) {
          if (bVar4 == 0x5b) {
            local_58 = yajl_tok_left_brace;
            goto LAB_0010387b;
          }
          if (bVar4 == 0x5d) {
            local_58 = yajl_tok_right_brace;
            goto LAB_0010387b;
          }
          if (bVar4 == 0x66) {
            lVar12 = 0;
            goto LAB_00102d84;
          }
        }
        else if (bVar4 < 0x7b) {
          if (bVar4 == 0x6e) {
            lVar12 = 0;
            goto LAB_00103765;
          }
          if (bVar4 == 0x74) {
            lVar12 = 0;
            goto LAB_00102b7f;
          }
        }
        else {
          if (bVar4 == 0x7b) {
            local_58 = yajl_tok_left_bracket;
            goto LAB_0010387b;
          }
          if (bVar4 == 0x7d) {
            local_58 = yajl_tok_right_bracket;
            goto LAB_0010387b;
          }
        }
switchD_0010290b_caseD_e:
        lexer->error = yajl_lex_invalid_char;
        goto LAB_00103876;
      }
      switch(bVar4) {
      case 9:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0x20:
        local_40 = local_40 + 1;
        uVar7 = *offset;
        break;
      default:
        goto switchD_0010290b_caseD_e;
      case 0x22:
        local_58 = yajl_tok_string;
        goto LAB_0010319d;
      case 0x2c:
        local_58 = yajl_tok_comma;
        goto LAB_0010387b;
      case 0x2d:
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
        if (*offset == 0) {
          *psVar1 = *psVar1 - 1;
          uVar7 = *offset;
        }
        else {
          uVar7 = *offset - 1;
          *offset = uVar7;
        }
        if (jsonTextLen <= uVar7) goto LAB_001036c7;
        puVar6 = jsonText;
        psVar9 = offset;
        if (((lexer->bufInUse != 0) && (sVar5 = yajl_buf_len(lexer->buf), sVar5 != 0)) &&
           (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), uVar7 < sVar5)) {
          puVar6 = yajl_buf_data(lexer->buf);
          psVar9 = psVar1;
        }
        sVar5 = *psVar9;
        *psVar9 = sVar5 + 1;
        uVar3 = puVar6[sVar5];
        if (uVar3 == '-') {
          if (jsonTextLen <= *offset) goto LAB_001036c7;
          puVar6 = jsonText;
          psVar9 = offset;
          if (((lexer->bufInUse != 0) && (sVar5 = yajl_buf_len(lexer->buf), sVar5 != 0)) &&
             (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), uVar7 < sVar5)) {
            puVar6 = yajl_buf_data(lexer->buf);
            psVar9 = psVar1;
          }
          sVar5 = *psVar9;
          *psVar9 = sVar5 + 1;
          uVar3 = puVar6[sVar5];
        }
        if (uVar3 != '0') {
          if ((byte)(uVar3 - 0x31) < 9) goto LAB_00102e37;
          sVar5 = *offset;
          psVar9 = offset;
          if (sVar5 == 0) {
            sVar5 = *psVar1;
            psVar9 = psVar1;
          }
          *psVar9 = sVar5 - 1;
          lexer->error = yajl_lex_missing_integer_after_minus;
          goto LAB_00103876;
        }
        if (*offset < jsonTextLen) {
          puVar6 = jsonText;
          psVar9 = offset;
          if (((lexer->bufInUse != 0) && (sVar5 = yajl_buf_len(lexer->buf), sVar5 != 0)) &&
             (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), uVar7 < sVar5)) {
            puVar6 = yajl_buf_data(lexer->buf);
            psVar9 = psVar1;
          }
          sVar5 = *psVar9;
          *psVar9 = sVar5 + 1;
          bVar4 = puVar6[sVar5];
          goto LAB_00102ea8;
        }
        goto LAB_001036c7;
      case 0x2f:
        uVar7 = *offset;
        if (lexer->allowComments == 0) {
          psVar9 = offset;
          if (uVar7 == 0) {
            uVar7 = *psVar1;
            psVar9 = psVar1;
          }
          *psVar9 = uVar7 - 1;
          lexer->error = yajl_lex_unallowed_comment;
          goto LAB_00103876;
        }
        if (jsonTextLen <= uVar7) goto LAB_001036c7;
        puVar6 = jsonText;
        psVar9 = offset;
        if (((lexer->bufInUse != 0) && (sVar5 = yajl_buf_len(lexer->buf), sVar5 != 0)) &&
           (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), uVar7 < sVar5)) {
          puVar6 = yajl_buf_data(lexer->buf);
          psVar9 = psVar1;
        }
        sVar5 = *psVar9;
        *psVar9 = sVar5 + 1;
        if (puVar6[sVar5] == '*') {
          if (*offset < jsonTextLen) {
            do {
              if (((lexer->bufInUse == 0) || (sVar5 = yajl_buf_len(lexer->buf), sVar5 == 0)) ||
                 (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), sVar5 <= uVar7)) {
                sVar8 = *offset;
                sVar5 = sVar8 + 1;
                *offset = sVar5;
                puVar6 = jsonText + sVar8;
              }
              else {
                puVar6 = yajl_buf_data(lexer->buf);
                sVar5 = lexer->bufOff;
                lexer->bufOff = sVar5 + 1;
                puVar6 = puVar6 + sVar5;
                sVar5 = *offset;
              }
              if (*puVar6 == '*') {
                if (jsonTextLen <= sVar5) break;
                puVar6 = jsonText;
                psVar9 = offset;
                if (((lexer->bufInUse != 0) && (sVar5 = yajl_buf_len(lexer->buf), sVar5 != 0)) &&
                   (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), uVar7 < sVar5)) {
                  puVar6 = yajl_buf_data(lexer->buf);
                  psVar9 = psVar1;
                }
                sVar5 = *psVar9;
                *psVar9 = sVar5 + 1;
                if (puVar6[sVar5] == '/') goto LAB_00102a10;
                if (*offset == 0) {
                  *psVar1 = *psVar1 - 1;
                  sVar5 = *offset;
                }
                else {
                  sVar5 = *offset - 1;
                  *offset = sVar5;
                }
              }
              if (jsonTextLen <= sVar5) break;
            } while( true );
          }
          goto LAB_001036c7;
        }
        if (puVar6[sVar5] != '/') goto switchD_0010290b_caseD_e;
        do {
          if (jsonTextLen <= *offset) goto LAB_001036c7;
          puVar6 = jsonText;
          psVar9 = offset;
          if (((lexer->bufInUse != 0) && (sVar5 = yajl_buf_len(lexer->buf), sVar5 != 0)) &&
             (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), uVar7 < sVar5)) {
            puVar6 = yajl_buf_data(lexer->buf);
            psVar9 = psVar1;
          }
          sVar5 = *psVar9;
          *psVar9 = sVar5 + 1;
        } while (puVar6[sVar5] != '\n');
LAB_00102a10:
        yajl_buf_clear(lexer->buf);
        lexer->bufInUse = 0;
        uVar7 = *offset;
        local_40 = uVar7;
        break;
      case 0x3a:
        local_58 = yajl_tok_colon;
        goto LAB_0010387b;
      }
    } while (uVar7 < jsonTextLen);
  }
LAB_001036c7:
  local_58 = yajl_tok_eof;
  bVar2 = true;
  goto LAB_001036ca;
  while( true ) {
    puVar6 = jsonText;
    psVar9 = offset;
    if (((lexer->bufInUse != 0) && (sVar5 = yajl_buf_len(lexer->buf), sVar5 != 0)) &&
       (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), uVar7 < sVar5)) {
      puVar6 = yajl_buf_data(lexer->buf);
      psVar9 = psVar1;
    }
    sVar5 = *psVar9;
    *psVar9 = sVar5 + 1;
    if ((uint)puVar6[sVar5] != (int)"alse"[lVar12]) goto LAB_00103809;
    lVar12 = lVar12 + 1;
    local_58 = yajl_tok_bool;
    if (lVar12 == 4) break;
LAB_00102d84:
    if (jsonTextLen <= *offset) goto LAB_001036c7;
  }
  goto LAB_0010387b;
  while( true ) {
    puVar6 = jsonText;
    psVar9 = offset;
    if (((lexer->bufInUse != 0) && (sVar5 = yajl_buf_len(lexer->buf), sVar5 != 0)) &&
       (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), uVar7 < sVar5)) {
      puVar6 = yajl_buf_data(lexer->buf);
      psVar9 = psVar1;
    }
    sVar5 = *psVar9;
    *psVar9 = sVar5 + 1;
    if ((uint)puVar6[sVar5] != (int)"ull"[lVar12]) goto LAB_00103809;
    lVar12 = lVar12 + 1;
    local_58 = yajl_tok_null;
    if (lVar12 == 3) break;
LAB_00103765:
    if (jsonTextLen <= *offset) goto LAB_001036c7;
  }
  goto LAB_0010387b;
  while( true ) {
    puVar6 = jsonText;
    psVar9 = offset;
    if (((lexer->bufInUse != 0) && (sVar5 = yajl_buf_len(lexer->buf), sVar5 != 0)) &&
       (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), uVar7 < sVar5)) {
      puVar6 = yajl_buf_data(lexer->buf);
      psVar9 = psVar1;
    }
    sVar5 = *psVar9;
    *psVar9 = sVar5 + 1;
    if ((uint)puVar6[sVar5] != (int)"rue"[lVar12]) goto LAB_00103809;
    lVar12 = lVar12 + 1;
    local_58 = yajl_tok_bool;
    if (lVar12 == 3) break;
LAB_00102b7f:
    if (jsonTextLen <= *offset) goto LAB_001036c7;
  }
  goto LAB_0010387b;
LAB_00103809:
  sVar5 = *offset;
  psVar9 = offset;
  if (sVar5 == 0) {
    sVar5 = *psVar1;
    psVar9 = psVar1;
  }
  *psVar9 = sVar5 - 1;
  lexer->error = yajl_lex_invalid_string;
  goto LAB_00103876;
  while( true ) {
    puVar6 = jsonText;
    psVar9 = offset;
    if (((lexer->bufInUse != 0) && (sVar5 = yajl_buf_len(lexer->buf), sVar5 != 0)) &&
       (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), uVar7 < sVar5)) {
      puVar6 = yajl_buf_data(lexer->buf);
      psVar9 = psVar1;
    }
    sVar5 = *psVar9;
    *psVar9 = sVar5 + 1;
    bVar4 = puVar6[sVar5];
    if (9 < (byte)(bVar4 - 0x30)) break;
LAB_00102e37:
    if (jsonTextLen <= *offset) goto LAB_001036c7;
  }
LAB_00102ea8:
  sVar5 = *offset;
  local_58 = yajl_tok_integer;
  if (bVar4 == 0x2e) {
    if (jsonTextLen <= sVar5) goto LAB_001036c7;
    puVar6 = jsonText;
    psVar9 = offset;
    if (((lexer->bufInUse != 0) && (sVar5 = yajl_buf_len(lexer->buf), sVar5 != 0)) &&
       (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), uVar7 < sVar5)) {
      puVar6 = yajl_buf_data(lexer->buf);
      psVar9 = psVar1;
    }
    sVar5 = *psVar9;
    *psVar9 = sVar5 + 1;
    if ((byte)(puVar6[sVar5] - 0x3a) < 0xf6) {
      sVar5 = *offset;
      psVar9 = offset;
      if (sVar5 == 0) {
        sVar5 = *psVar1;
        psVar9 = psVar1;
      }
      *psVar9 = sVar5 - 1;
      lexer->error = yajl_lex_missing_integer_after_decimal;
      goto LAB_00103876;
    }
    do {
      if (jsonTextLen <= *offset) goto LAB_001036c7;
      puVar6 = jsonText;
      psVar9 = offset;
      if (((lexer->bufInUse != 0) && (sVar5 = yajl_buf_len(lexer->buf), sVar5 != 0)) &&
         (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), uVar7 < sVar5)) {
        puVar6 = yajl_buf_data(lexer->buf);
        psVar9 = psVar1;
      }
      sVar5 = *psVar9;
      *psVar9 = sVar5 + 1;
      bVar4 = puVar6[sVar5];
    } while ((byte)(bVar4 - 0x30) < 10);
    sVar5 = *offset;
    local_58 = yajl_tok_double;
  }
  if ((bVar4 & 0xdf) == 0x45) {
    if (jsonTextLen <= sVar5) goto LAB_001036c7;
    puVar6 = jsonText;
    psVar9 = offset;
    if (((lexer->bufInUse != 0) && (sVar5 = yajl_buf_len(lexer->buf), sVar5 != 0)) &&
       (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), uVar7 < sVar5)) {
      puVar6 = yajl_buf_data(lexer->buf);
      psVar9 = psVar1;
    }
    sVar5 = *psVar9;
    *psVar9 = sVar5 + 1;
    uVar3 = puVar6[sVar5];
    if ((uVar3 == '-') || (uVar3 == '+')) {
      if (jsonTextLen <= *offset) goto LAB_001036c7;
      puVar6 = jsonText;
      psVar9 = offset;
      if (((lexer->bufInUse != 0) && (sVar5 = yajl_buf_len(lexer->buf), sVar5 != 0)) &&
         (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), uVar7 < sVar5)) {
        puVar6 = yajl_buf_data(lexer->buf);
        psVar9 = psVar1;
      }
      sVar5 = *psVar9;
      *psVar9 = sVar5 + 1;
      uVar3 = puVar6[sVar5];
    }
    if (9 < (byte)(uVar3 - 0x30)) {
      sVar5 = *offset;
      psVar9 = offset;
      if (sVar5 == 0) {
        sVar5 = *psVar1;
        psVar9 = psVar1;
      }
      *psVar9 = sVar5 - 1;
      lexer->error = yajl_lex_missing_integer_after_exponent;
      goto LAB_00103876;
    }
    do {
      if (jsonTextLen <= *offset) goto LAB_001036c7;
      puVar6 = jsonText;
      psVar9 = offset;
      if (((lexer->bufInUse != 0) && (sVar5 = yajl_buf_len(lexer->buf), sVar5 != 0)) &&
         (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), uVar7 < sVar5)) {
        puVar6 = yajl_buf_data(lexer->buf);
        psVar9 = psVar1;
      }
      sVar5 = *psVar9;
      *psVar9 = sVar5 + 1;
    } while ((byte)(puVar6[sVar5] - 0x30) < 10);
    sVar5 = *offset;
    local_58 = yajl_tok_double;
  }
  if (sVar5 == 0) {
    *psVar1 = *psVar1 - 1;
  }
  else {
    *offset = sVar5 - 1;
  }
  goto LAB_0010387b;
  while( true ) {
    if (("\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02"
         [bVar4] & 2U) != 0) {
      sVar5 = *offset;
      yVar11 = yajl_lex_string_invalid_json_char;
      goto LAB_0010385c;
    }
    if ((lexer->validateUTF8 != 0) && ((char)bVar4 < '\0')) break;
LAB_0010319d:
    if (((lexer->bufInUse == 0) || (sVar5 = yajl_buf_len(lexer->buf), sVar5 == 0)) ||
       (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), sVar5 <= uVar7)) {
      uVar7 = *offset;
      lVar12 = jsonTextLen - uVar7;
      if (uVar7 <= jsonTextLen && lVar12 != 0) {
        if (lVar12 == 0) {
          lVar14 = 0;
        }
        else {
          lVar13 = 0;
          do {
            lVar14 = lVar13;
            if ((byte)(((lexer->validateUTF8 != 0) << 4 | 10U) &
                      "\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02"
                      [jsonText[lVar13 + uVar7]]) != 0) break;
            lVar13 = lVar13 + 1;
            lVar14 = lVar12;
          } while (lVar12 != lVar13);
        }
        uVar7 = uVar7 + lVar14;
        *offset = uVar7;
      }
    }
    else {
      puVar6 = yajl_buf_data(lexer->buf);
      sVar5 = lexer->bufOff;
      sVar8 = yajl_buf_len(lexer->buf);
      lVar12 = sVar8 - lexer->bufOff;
      if (lVar12 == 0) {
        lVar14 = 0;
      }
      else {
        lVar13 = 0;
        do {
          lVar14 = lVar13;
          if ((byte)(((lexer->validateUTF8 != 0) << 4 | 10U) &
                    "\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02"
                    [puVar6[lVar13 + sVar5]]) != 0) break;
          lVar13 = lVar13 + 1;
          lVar14 = lVar12;
        } while (lVar12 != lVar13);
      }
      *psVar1 = lVar14 + lexer->bufOff;
      uVar7 = *offset;
    }
    if (jsonTextLen <= uVar7) goto LAB_001036c7;
    puVar6 = jsonText;
    psVar9 = offset;
    if (((lexer->bufInUse != 0) && (sVar5 = yajl_buf_len(lexer->buf), sVar5 != 0)) &&
       (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), uVar7 < sVar5)) {
      puVar6 = yajl_buf_data(lexer->buf);
      psVar9 = psVar1;
    }
    sVar5 = *psVar9;
    *psVar9 = sVar5 + 1;
    bVar4 = puVar6[sVar5];
    if ((ulong)bVar4 == 0x22) goto LAB_0010387b;
    if (bVar4 == 0x5c) {
      if (jsonTextLen <= *offset) goto LAB_001036c7;
      puVar6 = jsonText;
      psVar9 = offset;
      if (((lexer->bufInUse != 0) && (sVar5 = yajl_buf_len(lexer->buf), sVar5 != 0)) &&
         (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), uVar7 < sVar5)) {
        puVar6 = yajl_buf_data(lexer->buf);
        psVar9 = psVar1;
      }
      sVar5 = *psVar9;
      *psVar9 = sVar5 + 1;
      if ((ulong)puVar6[sVar5] == 0x75) {
        iVar10 = 4;
        do {
          if (jsonTextLen <= *offset) goto LAB_001036c7;
          puVar6 = jsonText;
          psVar9 = offset;
          if (((lexer->bufInUse != 0) && (sVar5 = yajl_buf_len(lexer->buf), sVar5 != 0)) &&
             (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), uVar7 < sVar5)) {
            puVar6 = yajl_buf_data(lexer->buf);
            psVar9 = psVar1;
          }
          sVar5 = *psVar9;
          *psVar9 = sVar5 + 1;
          if (("\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02"
               [puVar6[sVar5]] & 4U) == 0) {
            sVar5 = *offset;
            yVar11 = yajl_lex_string_invalid_hex_char;
            goto LAB_0010385c;
          }
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
        local_58 = yajl_tok_string_with_escapes;
      }
      else {
        local_58 = yajl_tok_string_with_escapes;
        if (("\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02"
             [puVar6[sVar5]] & 1U) == 0) {
          sVar5 = *offset;
          yVar11 = yajl_lex_string_invalid_escaped_char;
LAB_0010385c:
          psVar9 = offset;
          if (sVar5 == 0) {
            sVar5 = *psVar1;
            psVar9 = psVar1;
          }
          *psVar9 = sVar5 - 1;
          goto LAB_00103872;
        }
      }
      goto LAB_0010319d;
    }
  }
  if ((bVar4 & 0xe0) == 0xc0) {
    if (jsonTextLen <= *offset) goto LAB_001036c7;
    psVar9 = offset;
    if (((lexer->bufInUse != 0) && (sVar5 = yajl_buf_len(lexer->buf), sVar5 != 0)) &&
       (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), uVar7 < sVar5)) {
      yajl_buf_data(lexer->buf);
      psVar9 = psVar1;
    }
    *psVar9 = *psVar9 + 1;
    yVar11 = yajl_lex_string_invalid_utf8;
  }
  else if ((bVar4 & 0xf0) == 0xe0) {
    if (jsonTextLen <= *offset) goto LAB_001036c7;
    psVar9 = offset;
    if (((lexer->bufInUse != 0) && (sVar5 = yajl_buf_len(lexer->buf), sVar5 != 0)) &&
       (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), uVar7 < sVar5)) {
      yajl_buf_data(lexer->buf);
      psVar9 = psVar1;
    }
    *psVar9 = *psVar9 + 1;
    yVar11 = yajl_lex_string_invalid_utf8;
  }
  else {
    yVar11 = yajl_lex_string_invalid_utf8;
    if ((bVar4 & 0xf8) == 0xf0) {
      if (jsonTextLen <= *offset) goto LAB_001036c7;
      psVar9 = offset;
      if (((lexer->bufInUse != 0) && (sVar5 = yajl_buf_len(lexer->buf), sVar5 != 0)) &&
         (uVar7 = lexer->bufOff, sVar5 = yajl_buf_len(lexer->buf), uVar7 < sVar5)) {
        yajl_buf_data(lexer->buf);
        psVar9 = psVar1;
      }
      *psVar9 = *psVar9 + 1;
    }
  }
LAB_00103872:
  lexer->error = yVar11;
LAB_00103876:
  local_58 = yajl_tok_error;
LAB_0010387b:
  if (lexer->bufInUse == 0) {
    if (local_58 == yajl_tok_error) {
      return yajl_tok_error;
    }
    *outBuf = jsonText + local_40;
    *outLen = *offset - local_40;
  }
  else {
    bVar2 = false;
LAB_001036ca:
    if (lexer->bufInUse == 0) {
      yajl_buf_clear(lexer->buf);
    }
    lexer->bufInUse = 1;
    yajl_buf_append(lexer->buf,jsonText + local_40,*offset - local_40);
    lexer->bufOff = 0;
    if (!bVar2) {
      puVar6 = yajl_buf_data(lexer->buf);
      *outBuf = puVar6;
      sVar5 = yajl_buf_len(lexer->buf);
      *outLen = sVar5;
      lexer->bufInUse = 0;
    }
  }
  if ((local_58 & ~yajl_tok_colon) == yajl_tok_string) {
    *outBuf = *outBuf + 1;
    *outLen = *outLen - 2;
  }
  return local_58;
}

Assistant:

yajl_tok
yajl_lex_lex(yajl_lexer lexer, const unsigned char * jsonText,
             size_t jsonTextLen, size_t * offset,
             const unsigned char ** outBuf, size_t * outLen)
{
    yajl_tok tok = yajl_tok_error;
    unsigned char c;
    size_t startOffset = *offset;

    *outBuf = NULL;
    *outLen = 0;

    for (;;) {
        assert(*offset <= jsonTextLen);

        if (*offset >= jsonTextLen) {
            tok = yajl_tok_eof;
            goto lexed;
        }

        c = readChar(lexer, jsonText, offset);

        switch (c) {
            case '{':
                tok = yajl_tok_left_bracket;
                goto lexed;
            case '}':
                tok = yajl_tok_right_bracket;
                goto lexed;
            case '[':
                tok = yajl_tok_left_brace;
                goto lexed;
            case ']':
                tok = yajl_tok_right_brace;
                goto lexed;
            case ',':
                tok = yajl_tok_comma;
                goto lexed;
            case ':':
                tok = yajl_tok_colon;
                goto lexed;
            case '\t': case '\n': case '\v': case '\f': case '\r': case ' ':
                startOffset++;
                break;
            case 't': {
                const char * want = "rue";
                do {
                    if (*offset >= jsonTextLen) {
                        tok = yajl_tok_eof;
                        goto lexed;
                    }
                    c = readChar(lexer, jsonText, offset);
                    if (c != *want) {
                        unreadChar(lexer, offset);
                        lexer->error = yajl_lex_invalid_string;
                        tok = yajl_tok_error;
                        goto lexed;
                    }
                } while (*(++want));
                tok = yajl_tok_bool;
                goto lexed;
            }
            case 'f': {
                const char * want = "alse";
                do {
                    if (*offset >= jsonTextLen) {
                        tok = yajl_tok_eof;
                        goto lexed;
                    }
                    c = readChar(lexer, jsonText, offset);
                    if (c != *want) {
                        unreadChar(lexer, offset);
                        lexer->error = yajl_lex_invalid_string;
                        tok = yajl_tok_error;
                        goto lexed;
                    }
                } while (*(++want));
                tok = yajl_tok_bool;
                goto lexed;
            }
            case 'n': {
                const char * want = "ull";
                do {
                    if (*offset >= jsonTextLen) {
                        tok = yajl_tok_eof;
                        goto lexed;
                    }
                    c = readChar(lexer, jsonText, offset);
                    if (c != *want) {
                        unreadChar(lexer, offset);
                        lexer->error = yajl_lex_invalid_string;
                        tok = yajl_tok_error;
                        goto lexed;
                    }
                } while (*(++want));
                tok = yajl_tok_null;
                goto lexed;
            }
            case '"': {
                tok = yajl_lex_string(lexer, (const unsigned char *) jsonText,
                                      jsonTextLen, offset);
                goto lexed;
            }
            case '-':
            case '0': case '1': case '2': case '3': case '4':
            case '5': case '6': case '7': case '8': case '9': {
                /* integer parsing wants to start from the beginning */
                unreadChar(lexer, offset);
                tok = yajl_lex_number(lexer, (const unsigned char *) jsonText,
                                      jsonTextLen, offset);
                goto lexed;
            }
            case '/':
                /* hey, look, a probable comment!  If comments are disabled
                 * it's an error. */
                if (!lexer->allowComments) {
                    unreadChar(lexer, offset);
                    lexer->error = yajl_lex_unallowed_comment;
                    tok = yajl_tok_error;
                    goto lexed;
                }
                /* if comments are enabled, then we should try to lex
                 * the thing.  possible outcomes are
                 * - successful lex (tok_comment, which means continue),
                 * - malformed comment opening (slash not followed by
                 *   '*' or '/') (tok_error)
                 * - eof hit. (tok_eof) */
                tok = yajl_lex_comment(lexer, (const unsigned char *) jsonText,
                                       jsonTextLen, offset);
                if (tok == yajl_tok_comment) {
                    /* "error" is silly, but that's the initial
                     * state of tok.  guilty until proven innocent. */
                    tok = yajl_tok_error;
                    yajl_buf_clear(lexer->buf);
                    lexer->bufInUse = 0;
                    startOffset = *offset;
                    break;
                }
                /* hit error or eof, bail */
                goto lexed;
            default:
                lexer->error = yajl_lex_invalid_char;
                tok = yajl_tok_error;
                goto lexed;
        }
    }


  lexed:
    /* need to append to buffer if the buffer is in use or
     * if it's an EOF token */
    if (tok == yajl_tok_eof || lexer->bufInUse) {
        if (!lexer->bufInUse) yajl_buf_clear(lexer->buf);
        lexer->bufInUse = 1;
        yajl_buf_append(lexer->buf, jsonText + startOffset, *offset - startOffset);
        lexer->bufOff = 0;

        if (tok != yajl_tok_eof) {
            *outBuf = yajl_buf_data(lexer->buf);
            *outLen = yajl_buf_len(lexer->buf);
            lexer->bufInUse = 0;
        }
    } else if (tok != yajl_tok_error) {
        *outBuf = jsonText + startOffset;
        *outLen = *offset - startOffset;
    }

    /* special case for strings. skip the quotes. */
    if (tok == yajl_tok_string || tok == yajl_tok_string_with_escapes)
    {
        assert(*outLen >= 2);
        (*outBuf)++;
        *outLen -= 2;
    }


#ifdef YAJL_LEXER_DEBUG
    if (tok == yajl_tok_error) {
        printf("lexical error: %s\n",
               yajl_lex_error_to_string(yajl_lex_get_error(lexer)));
    } else if (tok == yajl_tok_eof) {
        printf("EOF hit\n");
    } else {
        printf("lexed %s: '", tokToStr(tok));
        fwrite(*outBuf, 1, *outLen, stdout);
        printf("'\n");
    }
#endif

    return tok;
}